

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.cpp
# Opt level: O0

void __thiscall
spvtools::opt::analysis::TypeManager::AttachDecoration
          (TypeManager *this,Instruction *inst,Type *type)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Struct *st;
  undefined1 local_68 [4];
  uint32_t i_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> data_1;
  uint32_t index;
  uint32_t count_1;
  undefined1 local_40 [4];
  uint32_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> data;
  uint32_t count;
  Op opcode;
  Type *type_local;
  Instruction *inst_local;
  TypeManager *this_local;
  
  data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = Instruction::opcode(inst);
  bVar1 = IsAnnotationInst(data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  if (bVar1) {
    if (data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ == OpDecorate) {
      data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = Instruction::NumOperands(inst);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
      for (count_1 = 1;
          count_1 < (uint32_t)
                    data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage; count_1 = count_1 + 1) {
        index = Instruction::GetSingleWordOperand(inst,count_1);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,&index);
      }
      Type::AddDecoration(type,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
    }
    else {
      if (data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ != OpMemberDecorate) {
        __assert_fail("false && \"Unexpected opcode for a decoration instruction.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/type_manager.cpp"
                      ,0x3c3,
                      "void spvtools::opt::analysis::TypeManager::AttachDecoration(const Instruction &, Type *)"
                     );
      }
      data_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = Instruction::NumOperands(inst);
      data_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = Instruction::GetSingleWordOperand(inst,1);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
      for (st._4_4_ = 2;
          st._4_4_ <
          data_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_; st._4_4_ = st._4_4_ + 1) {
        st._0_4_ = Instruction::GetSingleWordOperand(inst,st._4_4_);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,
                   (value_type_conflict2 *)&st);
      }
      iVar2 = (*type->_vptr_Type[0x1b])();
      if ((Struct *)CONCAT44(extraout_var,iVar2) != (Struct *)0x0) {
        Struct::AddMemberDecoration
                  ((Struct *)CONCAT44(extraout_var,iVar2),
                   (uint32_t)
                   data_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
    }
  }
  return;
}

Assistant:

void TypeManager::AttachDecoration(const Instruction& inst, Type* type) {
  const spv::Op opcode = inst.opcode();
  if (!IsAnnotationInst(opcode)) return;

  switch (opcode) {
    case spv::Op::OpDecorate: {
      const auto count = inst.NumOperands();
      std::vector<uint32_t> data;
      for (uint32_t i = 1; i < count; ++i) {
        data.push_back(inst.GetSingleWordOperand(i));
      }
      type->AddDecoration(std::move(data));
    } break;
    case spv::Op::OpMemberDecorate: {
      const auto count = inst.NumOperands();
      const uint32_t index = inst.GetSingleWordOperand(1);
      std::vector<uint32_t> data;
      for (uint32_t i = 2; i < count; ++i) {
        data.push_back(inst.GetSingleWordOperand(i));
      }
      if (Struct* st = type->AsStruct()) {
        st->AddMemberDecoration(index, std::move(data));
      }
    } break;
    default:
      assert(false && "Unexpected opcode for a decoration instruction.");
      break;
  }
}